

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall
Hydro::MacProjector::updateBeta
          (MacProjector *this,
          Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
          *a_beta)

{
  bool bVar1;
  Location a_beta_loc;
  Long LVar2;
  pointer i;
  MLABecLaplacian *in_RSI;
  long in_RDI;
  int ilev_1;
  int ilev;
  bool has_eb;
  int nlevs;
  char *in_stack_00000198;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  nullptr_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  char *in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    amrex::Assert_host(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_00000198);
  }
  bVar1 = std::operator==((unique_ptr<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 =
         "\"MacProjector::updateBeta: should not be called for constant beta\"";
    amrex::Assert_host(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_00000198);
  }
  LVar2 = amrex::
          Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
          ::size((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                  *)0x74d2f2);
  a_beta_loc = (Location)LVar2;
  amrex::
  Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
  ::operator[]((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (size_type)in_stack_ffffffffffffff78);
  std::array<const_amrex::MultiFab_*,_3UL>::operator[]
            ((array<const_amrex::MultiFab_*,_3UL> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (size_type)in_stack_ffffffffffffff78);
  bVar1 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    for (iVar3 = 0; iVar3 < (int)a_beta_loc; iVar3 = iVar3 + 1) {
      std::unique_ptr<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>::operator->
                ((unique_ptr<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_> *)
                 0x74d345);
      amrex::
      Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
      ::operator[]((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (size_type)in_stack_ffffffffffffff78);
      amrex::MLEBABecLap::setBCoeffs
                ((MLEBABecLap *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),
                 (Array<const_MultiFab_*,_3> *)in_RSI,a_beta_loc);
    }
  }
  else {
    for (iVar3 = 0; iVar3 < (int)a_beta_loc; iVar3 = iVar3 + 1) {
      i = std::unique_ptr<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>::
          operator->((unique_ptr<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>
                      *)0x74d3ac);
      amrex::
      Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
      ::operator[]((Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffff80),(size_type)i);
      amrex::MLABecLaplacian::setBCoeffs
                (in_RSI,a_beta_loc,
                 (Array<const_MultiFab_*,_3> *)CONCAT44(in_stack_ffffffffffffffa4,iVar3));
    }
  }
  return;
}

Assistant:

void MacProjector::updateBeta (
    const Vector<Array<MultiFab const*, AMREX_SPACEDIM>>& a_beta)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_linop != nullptr,
        "MacProjector::updateBeta: initProjector must be called before calling this method");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_poisson == nullptr,
        "MacProjector::updateBeta: should not be called for constant beta");

    const int nlevs = a_beta.size();
#ifdef AMREX_USE_EB
    const bool has_eb = a_beta[0][0]->hasEBFabFactory();
    if (has_eb) {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_eb_abeclap->setBCoeffs(ilev, a_beta[ilev], m_beta_loc);
    } else
#endif
    {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_abeclap->setBCoeffs(ilev, a_beta[ilev]);
    }
}